

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_prefix(CHAR_DATA *ch,char *argument)

{
  char *pcVar1;
  char buf [4608];
  char acStack_1218 [4616];
  
  if (*argument == '\0') {
    if (*ch->prefix == '\0') {
      send_to_char("You have no prefix to clear.\r\n",ch);
      return;
    }
    send_to_char("Prefix removed.\r\n",ch);
    free_pstring(ch->prefix);
    argument = "";
  }
  else if (*ch->prefix == '\0') {
    sprintf(acStack_1218,"Prefix set to %s.\r\n",argument);
  }
  else {
    sprintf(acStack_1218,"Prefix changed to %s.\r\n",argument);
    free_pstring(ch->prefix);
  }
  pcVar1 = palloc_string(argument);
  ch->prefix = pcVar1;
  return;
}

Assistant:

void do_prefix(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_INPUT_LENGTH];

	if (argument[0] == '\0')
	{
		if (ch->prefix[0] == '\0')
		{
			send_to_char("You have no prefix to clear.\r\n", ch);
			return;
		}

		send_to_char("Prefix removed.\r\n", ch);

		free_pstring(ch->prefix);
		ch->prefix = palloc_string("");

		return;
	}

	if (ch->prefix[0] != '\0')
	{
		sprintf(buf, "Prefix changed to %s.\r\n", argument);
		free_pstring(ch->prefix);
	}
	else
	{
		sprintf(buf, "Prefix set to %s.\r\n", argument);
	}

	ch->prefix = palloc_string(argument);
}